

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# usdGeom.cc
# Opt level: O2

bool __thiscall
tinyusdz::GeomPrimvar::get_value<tinyusdz::value::point3f>
          (GeomPrimvar *this,point3f *dest,string *err)

{
  Attribute *this_00;
  float fVar1;
  bool bVar2;
  uint32_t tyid;
  value_type *pvVar3;
  vector<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
  *this_01;
  const_reference pvVar4;
  point3f *ppVar5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RCX;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_R8;
  optional<tinyusdz::value::point3f> pv;
  allocator local_a5;
  undefined1 local_a4 [4];
  undefined1 local_a0 [16];
  undefined1 local_90 [32];
  string local_70;
  string local_50 [32];
  
  if (dest != (point3f *)0x0) {
    this_00 = &this->_attr;
    bVar2 = Attribute::is_blocked(this_00);
    if (!bVar2) {
      bVar2 = primvar::PrimVar::has_value(&(this->_attr)._var);
      if (!bVar2) {
        if (*(pointer *)
             ((long)&(this->_attr)._var._ts._samples.
                     super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
                     ._M_impl.super__Vector_impl_data + 8) ==
            (this->_attr)._var._ts._samples.
            super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
            ._M_impl.super__Vector_impl_data._M_start) {
          return (bool)(allocator)0x0;
        }
        this_01 = tinyusdz::value::TimeSamples::get_samples(&(this->_attr)._var._ts);
        pvVar4 = std::
                 vector<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
                 ::at(this_01,0);
        ppVar5 = tinyusdz::value::Value::as<tinyusdz::value::point3f>(&pvVar4->value,false);
        if (ppVar5 != (point3f *)0x0) {
          dest->z = ppVar5->z;
          fVar1 = ppVar5->y;
          dest->x = ppVar5->x;
          dest->y = fVar1;
          return (bool)(allocator)0x1;
        }
        return (bool)(allocator)0x0;
      }
      tyid = Attribute::type_id(this_00);
      bVar2 = IsSupportedGeomPrimvarType(tyid);
      if (!bVar2) {
        if (err == (string *)0x0) {
          return (bool)(allocator)0x0;
        }
        std::__cxx11::string::string
                  (local_50,"Unsupported type for GeomPrimvar. type = `{}`",(allocator *)local_a0);
        Attribute::type_name_abi_cxx11_(&local_70,this_00);
        fmt::format<std::__cxx11::string>((string *)local_90,(fmt *)local_50,&local_70,in_RCX);
        std::__cxx11::string::append((string *)err);
        std::__cxx11::string::_M_dispose();
        std::__cxx11::string::_M_dispose();
        std::__cxx11::string::_M_dispose();
        return (bool)(allocator)0x0;
      }
      Attribute::get_value<tinyusdz::value::point3f>
                ((optional<tinyusdz::value::point3f> *)local_90,this_00);
      local_a0[0] = (allocator)local_90[0];
      if ((allocator)local_90[0] == (allocator)0x1) {
        local_a0._12_4_ = local_90._12_4_;
        local_a0._4_8_ = local_90._4_8_;
        pvVar3 = nonstd::optional_lite::optional<tinyusdz::value::point3f>::value
                           ((optional<tinyusdz::value::point3f> *)local_a0);
        fVar1 = pvVar3->y;
        dest->x = pvVar3->x;
        dest->y = fVar1;
        dest->z = pvVar3->z;
        return (bool)(allocator)0x1;
      }
      if (err != (string *)0x0) {
        std::__cxx11::string::string
                  (local_50,
                   "Attribute value type mismatch. Requested type `{}` but Attribute has type `{}`",
                   &local_a5);
        local_a4 = (undefined1  [4])0x40;
        Attribute::type_name_abi_cxx11_(&local_70,this_00);
        fmt::format<unsigned_int,std::__cxx11::string>
                  ((string *)local_90,(fmt *)local_50,(string *)local_a4,(uint *)&local_70,in_R8);
        std::__cxx11::string::append((string *)err);
        std::__cxx11::string::_M_dispose();
        std::__cxx11::string::_M_dispose();
        std::__cxx11::string::_M_dispose();
        return (bool)local_90[0];
      }
      return (bool)local_90[0];
    }
  }
  if (err != (string *)0x0) {
    std::__cxx11::string::append((char *)err);
  }
  return false;
}

Assistant:

bool GeomPrimvar::get_value(T *dest, std::string *err) const {
  static_assert(tinyusdz::value::TypeTraits<T>::type_id() != value::TypeTraits<value::token>::type_id(), "`token` type is not supported as a GeomPrimvar");
  static_assert(tinyusdz::value::TypeTraits<T>::type_id() != value::TypeTraits<std::vector<value::token>>::type_id(), "`token[]` type is not supported as a GeomPrimvar");

  if (!dest) {
    if (err) {
      (*err) += "Output value is nullptr.";
    }
    return false;
  }

  if (_attr.is_blocked()) {
    if (err) {
      (*err) += "Attribute is blocked.";
    }
    return false;
  }

  if (_attr.has_value()) {
    if (!IsSupportedGeomPrimvarType(_attr.type_id())) {
      if (err) {
        (*err) += fmt::format("Unsupported type for GeomPrimvar. type = `{}`",
                              _attr.type_name());
      }
      return false;
    }

    if (auto pv = _attr.get_value<T>()) {

      // copy
      (*dest) = pv.value();
      return true;

    } else {
      if (err) {
        (*err) += fmt::format("Attribute value type mismatch. Requested type `{}` but Attribute has type `{}`", value::TypeTraits<T>::type_id(), _attr.type_name());
      }
      return false;
    }
  }

  if (_attr.has_timesamples()) {
    // Return the first sample.
    const auto &ts = _attr.get_var().ts_raw();
    if (ts.empty()) {
      if (err) {
        (*err) += "No TimeSample value in Attribute..";
      }
      return false;
    }
    
    if (auto pv =ts.get_samples().at(0).value.as<T>()) {
      (*dest) = (*pv);
      return true;
    }
  }

  return false;
}